

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

void CountRec(ON_RTreeNode *a_node,int *a_count)

{
  bool bVar1;
  int local_1c;
  int index;
  int *a_count_local;
  ON_RTreeNode *a_node_local;
  
  bVar1 = ON_RTreeNode::IsInternalNode(a_node);
  if (bVar1) {
    for (local_1c = 0; local_1c < a_node->m_count; local_1c = local_1c + 1) {
      CountRec(a_node->m_branch[local_1c].field_1.m_child,a_count);
    }
  }
  else {
    *a_count = a_node->m_count + *a_count;
  }
  return;
}

Assistant:

static void CountRec(ON_RTreeNode* a_node, int& a_count)
{
  if(a_node->IsInternalNode())  // not a leaf node
  {
    for(int index = 0; index < a_node->m_count; ++index)
    {
      CountRec(a_node->m_branch[index].m_child, a_count);
    }
  }
  else // A leaf node
  {
    a_count += a_node->m_count;
  }
}